

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O2

int ndn_key_storage_set_self_identity(ndn_data_t *self_cert,ndn_ecc_prv_t *self_prv_key)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  uint8_t *__dest;
  long lVar7;
  long lVar8;
  ndn_data_t *component;
  
  if (!_key_storage_initialized) {
    _ndn_key_storage_init();
  }
  __dest = repo_buf + 0x140;
  lVar7 = 0x1bc;
  lVar8 = 0x508;
  do {
    lVar6 = lVar8;
    if (lVar6 + 0x2c == 0x5b8) {
      return -10;
    }
    __dest = __dest + 0x890;
    lVar7 = lVar7 + -0x1bc;
    lVar8 = lVar6 + 0x2c;
  } while (*(int *)(storage.self_identity[0].components[1].value + lVar6 + 0x20) != -1);
  memcpy(__dest,self_cert,0x890);
  uVar1 = *(undefined8 *)((self_prv_key->abs_key).key_value + 8);
  uVar2 = *(undefined8 *)((self_prv_key->abs_key).key_value + 0x10);
  uVar3 = *(undefined8 *)((self_prv_key->abs_key).key_value + 0x18);
  uVar4 = *(undefined8 *)((self_prv_key->abs_key).key_value + 0x1c);
  uVar5 = *(undefined8 *)&self_prv_key->key_id;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + -4) =
       *(undefined8 *)(self_prv_key->abs_key).key_value;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + 4) = uVar1;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + 0xc) = uVar2;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + 0x14) = uVar3;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + 0x18) = uVar4;
  *(undefined8 *)(storage.self_identity[0].components[1].value + lVar6 + 0x20) = uVar5;
  component = self_cert;
  for (lVar8 = 0; lVar8 < (long)((ulong)(self_cert->name).components_size - 4); lVar8 = lVar8 + 1) {
    ndn_name_append_component((ndn_name_t *)((long)&storage - lVar7),(name_component_t *)component);
    component = (ndn_data_t *)((component->name).components + 1);
  }
  ndn_name_print((ndn_name_t *)((long)&storage - lVar7));
  return 0;
}

Assistant:

int
ndn_key_storage_set_self_identity(const ndn_data_t* self_cert, const ndn_ecc_prv_t* self_prv_key)
{
  if (!_key_storage_initialized)
    _ndn_key_storage_init();
  for (int i = 0; i < NDN_SEC_CERT_SIZE; i++) {
    if (storage.self_identity_key[i].key_id == NDN_SEC_INVALID_KEY_ID) {
      memcpy(&storage.self_cert[i], self_cert, sizeof(ndn_data_t));
      memcpy(&storage.self_identity_key[i], self_prv_key, sizeof(ndn_ecc_prv_t));
      for (int j = 0; j < self_cert->name.components_size - 4; j++) {
        ndn_name_append_component(&storage.self_identity[i], &self_cert->name.components[j]);
      }
      ndn_name_print(&storage.self_identity[i]);
      return NDN_SUCCESS;
    }
  }
  return NDN_OVERSIZE;
}